

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O0

voidpf ft_gzip_alloc(voidpf opaque,uInt items,uInt size)

{
  FT_Pointer pvVar1;
  FT_Pointer p;
  long lStack_28;
  FT_Error error;
  FT_ULong sz;
  FT_Memory memory;
  uInt size_local;
  uInt items_local;
  voidpf opaque_local;
  
  lStack_28 = (ulong)size * (ulong)items;
  sz = (FT_ULong)opaque;
  memory._0_4_ = size;
  memory._4_4_ = items;
  _size_local = opaque;
  pvVar1 = ft_mem_alloc((FT_Memory)opaque,lStack_28,(FT_Error *)((long)&p + 4));
  return pvVar1;
}

Assistant:

static voidpf
  ft_gzip_alloc( voidpf  opaque,
                 uInt    items,
                 uInt    size )
  {
    FT_Memory   memory = (FT_Memory)opaque;
    FT_ULong    sz     = (FT_ULong)size * items;
    FT_Error    error;
    FT_Pointer  p      = NULL;


    /* allocate and zero out */
    FT_MEM_ALLOC( p, sz );
    return p;
  }